

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<256U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<256u,unsigned_int,void,false>
          (uintwide_t<256U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<256U,_unsigned_int,_void,_false> *a,
          uintwide_t<256U,_unsigned_int,_void,_false> *b)

{
  uint *puVar1;
  value_type_conflict *pvVar2;
  int *piVar3;
  int *piVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar15;
  unsigned_long vr;
  unsigned_fast_type uVar16;
  unsigned_fast_type n;
  long lVar17;
  bool bVar18;
  reverse_iterator<const_unsigned_int_*> pb;
  undefined1 *puVar19;
  long lVar20;
  value_type_conflict *pvVar21;
  ulong uVar22;
  unsigned_fast_type n_00;
  local_wide_integer_type u;
  local_wide_integer_type v;
  uintwide_t<256U,_unsigned_int,_void,_false> local_b8;
  uintwide_t<256U,_unsigned_int,_void,_false> local_98;
  uintwide_t<256U,_unsigned_int,_void,_false> local_78;
  undefined1 local_58 [40];
  
  uVar5 = *(unsigned_long *)this;
  local_98.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_98.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_98.values.super_array<unsigned_int,_8UL>.elems[0] = (int)uVar5;
  local_98.values.super_array<unsigned_int,_8UL>.elems[1] = (int)(uVar5 >> 0x20);
  uVar7 = local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  local_98.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  uVar6 = *(unsigned_long *)(a->values).super_array<unsigned_int,_8UL>.elems;
  local_78.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 4);
  local_78.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 6);
  local_78.values.super_array<unsigned_int,_8UL>.elems[0] = (int)uVar6;
  local_78.values.super_array<unsigned_int,_8UL>.elems[1] = (int)(uVar6 >> 0x20);
  uVar9 = local_78.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  local_78.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 2);
  lVar17 = 0x1c;
  do {
    if (lVar17 == -4) goto LAB_00135664;
    piVar3 = (int *)((long)local_98.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    piVar4 = (int *)((long)local_78.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    lVar17 = lVar17 + -4;
  } while (*piVar3 == *piVar4);
  local_78.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar6;
  if (local_78.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
    local_b8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    lVar17 = 0x1c;
    do {
      if (lVar17 == -4) goto LAB_00135664;
      piVar4 = (int *)((long)local_78.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      piVar3 = (int *)((long)local_b8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      lVar17 = lVar17 + -4;
    } while (*piVar4 == *piVar3);
  }
  local_98.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar5;
  if (local_98.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
    local_b8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
    local_b8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    lVar17 = 0x1c;
    do {
      if (lVar17 == -4) {
        local_b8.values.super_array<unsigned_int,_8UL>.elems[0] =
             (a->values).super_array<unsigned_int,_8UL>.elems[0];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[1] =
             (a->values).super_array<unsigned_int,_8UL>.elems[1];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[2] =
             (a->values).super_array<unsigned_int,_8UL>.elems[2];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[3] =
             (a->values).super_array<unsigned_int,_8UL>.elems[3];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[4] =
             (a->values).super_array<unsigned_int,_8UL>.elems[4];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[5] =
             (a->values).super_array<unsigned_int,_8UL>.elems[5];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[6] =
             (a->values).super_array<unsigned_int,_8UL>.elems[6];
        local_b8.values.super_array<unsigned_int,_8UL>.elems[7] =
             (a->values).super_array<unsigned_int,_8UL>.elems[7];
        goto LAB_0013585a;
      }
      piVar4 = (int *)((long)local_98.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      piVar3 = (int *)((long)local_b8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      lVar17 = lVar17 + -4;
    } while (*piVar4 == *piVar3);
  }
  local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar7;
  local_78.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar9;
  uVar16 = lsb<256u,unsigned_int,void,false>(&local_98);
  n = lsb<256u,unsigned_int,void,false>(&local_78);
  n_00 = uVar16;
  if (n < uVar16) {
    n_00 = n;
  }
  if (uVar16 != 0) {
    if ((uVar16 & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_98,uVar16);
    }
    else {
      local_98.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_98.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
  if (n != 0) {
    if ((n & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_78,n);
    }
    else {
      local_78.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_78.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
  puVar19 = local_58;
  pvVar21 = (value_type_conflict *)&local_78;
LAB_001356c1:
  uVar13 = local_98.values.super_array<unsigned_int,_8UL>.elems._24_8_;
  uVar11 = local_98.values.super_array<unsigned_int,_8UL>.elems._16_8_;
  uVar9 = local_98.values.super_array<unsigned_int,_8UL>.elems._8_8_;
  uVar7 = local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  if ((uintwide_t<256U,_unsigned_int,_void,_false> *)pvVar21 != &local_98) goto code_r0x001356cb;
  goto LAB_00135708;
LAB_00135664:
  local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = *(value_type_conflict *)this;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = *(value_type_conflict *)(this + 4);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[2] = *(value_type_conflict *)(this + 8);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[3] = *(value_type_conflict *)(this + 0xc);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[4] = *(value_type_conflict *)(this + 0x10);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[5] = *(value_type_conflict *)(this + 0x14);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[6] = *(value_type_conflict *)(this + 0x18);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[7] = *(value_type_conflict *)(this + 0x1c);
  goto LAB_0013585a;
code_r0x001356cb:
  puVar1 = (uint *)(puVar19 + -4);
  pvVar2 = pvVar21 + -1;
  puVar19 = puVar19 + -4;
  pvVar21 = pvVar21 + -1;
  if (*pvVar2 == *puVar1) goto LAB_001356c1;
  if (*puVar1 < *pvVar2) {
    local_98.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[0];
    local_98.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[1];
    uVar8 = local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_;
    local_98.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[2];
    local_98.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[3];
    uVar10 = local_98.values.super_array<unsigned_int,_8UL>.elems._8_8_;
    local_98.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[4];
    local_98.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[5];
    uVar12 = local_98.values.super_array<unsigned_int,_8UL>.elems._16_8_;
    local_98.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[6];
    local_98.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_78.values.super_array<unsigned_int,_8UL>.elems[7];
    uVar14 = local_98.values.super_array<unsigned_int,_8UL>.elems._24_8_;
    local_98.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar7;
    local_98.values.super_array<unsigned_int,_8UL>.elems[1] = SUB84(uVar7,4);
    local_78.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[0];
    local_78.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[1];
    local_98.values.super_array<unsigned_int,_8UL>.elems[2] = (value_type_conflict)uVar9;
    local_98.values.super_array<unsigned_int,_8UL>.elems[3] = SUB84(uVar9,4);
    local_78.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[2];
    local_78.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[3];
    local_98.values.super_array<unsigned_int,_8UL>.elems[4] = (value_type_conflict)uVar11;
    local_98.values.super_array<unsigned_int,_8UL>.elems[5] = SUB84(uVar11,4);
    local_78.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[4];
    local_78.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[5];
    local_98.values.super_array<unsigned_int,_8UL>.elems[6] = (value_type_conflict)uVar13;
    local_98.values.super_array<unsigned_int,_8UL>.elems[7] = SUB84(uVar13,4);
    local_78.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[6];
    local_78.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_98.values.super_array<unsigned_int,_8UL>.elems[7];
    local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar8;
    local_98.values.super_array<unsigned_int,_8UL>.elems._8_8_ = uVar10;
    local_98.values.super_array<unsigned_int,_8UL>.elems._16_8_ = uVar12;
    local_98.values.super_array<unsigned_int,_8UL>.elems._24_8_ = uVar14;
  }
LAB_00135708:
  lVar17 = 0x1c;
  do {
    if (lVar17 == -4) goto LAB_00135817;
    piVar3 = (int *)((long)local_98.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    piVar4 = (int *)((long)local_78.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    lVar17 = lVar17 + -4;
  } while (*piVar3 == *piVar4);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = 0xffffffff;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = 0xffffffff;
  eVar15 = operator<=(&local_78,(unsigned_long *)&local_b8);
  if (!eVar15) {
    lVar17 = 0;
    bVar18 = false;
    do {
      uVar22 = ((ulong)local_78.values.super_array<unsigned_int,_8UL>.elems[lVar17] - (ulong)bVar18)
               - (ulong)local_98.values.super_array<unsigned_int,_8UL>.elems[lVar17];
      local_78.values.super_array<unsigned_int,_8UL>.elems[lVar17] = (value_type_conflict)uVar22;
      bVar18 = uVar22 >> 0x20 != 0;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    uVar16 = lsb<256u,unsigned_int,void,false>(&local_78);
    puVar19 = local_58;
    pvVar21 = (value_type_conflict *)&local_78;
    if (uVar16 != 0) {
      if ((uVar16 & 0xffffff00) == 0) {
        uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_78,uVar16);
      }
      else {
        local_78.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
        local_78.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
      }
    }
    goto LAB_001356c1;
  }
  uVar22 = detail::gcd_unsafe<unsigned_long>
                     (local_78.values.super_array<unsigned_int,_8UL>.elems._0_8_,
                      local_98.values.super_array<unsigned_int,_8UL>.elems._0_8_);
  local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
  local_b8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
  lVar17 = 0;
  if (uVar22 == 0) {
LAB_001357e9:
    memset((void *)((long)local_b8.values.super_array<unsigned_int,_8UL>.elems + lVar17),0,
           0x20 - lVar17);
  }
  else {
    do {
      lVar20 = lVar17;
      *(int *)((long)local_b8.values.super_array<unsigned_int,_8UL>.elems + lVar20) = (int)uVar22;
      lVar17 = lVar20 + 4;
      uVar22 = uVar22 >> 0x20;
      if (uVar22 == 0) break;
    } while (lVar20 != 0x1c);
    if (lVar20 != 0x1c) goto LAB_001357e9;
  }
  local_98.values.super_array<unsigned_int,_8UL>.elems[4] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[4];
  local_98.values.super_array<unsigned_int,_8UL>.elems[5] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[5];
  local_98.values.super_array<unsigned_int,_8UL>.elems[6] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[6];
  local_98.values.super_array<unsigned_int,_8UL>.elems[7] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[7];
  local_98.values.super_array<unsigned_int,_8UL>.elems[0] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[0];
  local_98.values.super_array<unsigned_int,_8UL>.elems[1] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[1];
  local_98.values.super_array<unsigned_int,_8UL>.elems[2] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[2];
  local_98.values.super_array<unsigned_int,_8UL>.elems[3] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[3];
LAB_00135817:
  local_b8.values.super_array<unsigned_int,_8UL>.elems[4] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[4];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[5] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[5];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[6] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[6];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[7] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[7];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[0] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[0];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[1] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[1];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[2] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[2];
  local_b8.values.super_array<unsigned_int,_8UL>.elems[3] =
       local_98.values.super_array<unsigned_int,_8UL>.elems[3];
  if (n_00 != 0) {
    if ((n_00 & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shl<unsigned_long>(&local_b8,n_00);
    }
    else {
      local_b8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_b8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
LAB_0013585a:
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[4] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[4];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[5] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[5];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[6] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[6];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[7] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[7];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[0] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[0];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[1] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[1];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[2] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[2];
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[3] =
       local_b8.values.super_array<unsigned_int,_8UL>.elems[3];
  return __return_storage_ptr__;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }